

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<kj::AuthenticatedStream> __thiscall
kj::CapabilityStreamConnectionReceiver::acceptAuthenticated
          (CapabilityStreamConnectionReceiver *this)

{
  PromiseArena *pPVar1;
  ConnectionReceiver CVar2;
  PromiseArenaMember *in_RAX;
  void *pvVar3;
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  int in_ESI;
  TransformPromiseNodeBase *this_00;
  ConnectionReceiver local_28;
  
  local_28._vptr_ConnectionReceiver = (_func_int **)in_RAX;
  accept((CapabilityStreamConnectionReceiver *)&local_28,in_ESI,in_RDX,in_RCX);
  CVar2._vptr_ConnectionReceiver = local_28._vptr_ConnectionReceiver;
  pPVar1 = (PromiseArena *)local_28._vptr_ConnectionReceiver[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_28._vptr_ConnectionReceiver - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_28,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2771:24)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_0070cb90;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    local_28._vptr_ConnectionReceiver[1] = (_func_int *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_28._vptr_ConnectionReceiver + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_28,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2771:24)>
               ::anon_class_1_0_00000001_for_func::operator());
    CVar2._vptr_ConnectionReceiver[-5] = (_func_int *)&PTR_destroy_0070cb90;
    ((PromiseArenaMember *)(CVar2._vptr_ConnectionReceiver + -4))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  CVar2._vptr_ConnectionReceiver = local_28._vptr_ConnectionReceiver;
  (this->super_ConnectionReceiver)._vptr_ConnectionReceiver = (_func_int **)this_00;
  if ((PromiseArenaMember *)local_28._vptr_ConnectionReceiver != (PromiseArenaMember *)0x0) {
    local_28._vptr_ConnectionReceiver = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)CVar2._vptr_ConnectionReceiver);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> CapabilityStreamConnectionReceiver::acceptAuthenticated() {
  return accept().then([](Own<AsyncIoStream>&& stream) {
    return AuthenticatedStream { kj::mv(stream), UnknownPeerIdentity::newInstance() };
  });
}